

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

FFSIndexItem FFSread_index(FFSFile ffsfile)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__src;
  long lVar5;
  uint *puVar6;
  FFSIndexItem p_Var7;
  void *pvVar8;
  long in_RDI;
  int end;
  int currentPos;
  size_t index_size;
  off_t index_fpos;
  FFSIndexItem index_item;
  char *index_data;
  char *in_stack_00000030;
  FFSFile in_stack_00000088;
  size_t in_stack_ffffffffffffffd0;
  size_t s;
  
  iVar2 = (*ffs_file_lseek_func)(*(void **)(in_RDI + 0x20),0,1);
  iVar3 = (*ffs_file_lseek_func)(*(void **)(in_RDI + 0x20),0,2);
  (*ffs_file_lseek_func)(*(void **)(in_RDI + 0x20),(long)iVar2,0);
  if (*(int *)(in_RDI + 0x48) == 0) {
    next_record_type(in_stack_00000088);
  }
  while (*(int *)(in_RDI + 0x54) != 0x20) {
    iVar4 = FFSconsume_next_item((FFSFile)CONCAT44(iVar2,iVar3));
    if (iVar4 == 0) {
      return (FFSIndexItem)0x0;
    }
  }
  __src = ffs_malloc(in_stack_ffffffffffffffd0);
  s = *(size_t *)(in_RDI + 0x38);
  update_fpos((FFSFile)0x122ba4);
  lVar5 = *(long *)(in_RDI + 0x78) + -4;
  iVar2 = (**(code **)(in_RDI + 0xc0))
                    (*(undefined8 *)(in_RDI + 0x20),(long)__src + 4,*(long *)(in_RDI + 0x38) + -4,0)
  ;
  if ((long)iVar2 != *(long *)(in_RDI + 0x38) + -4) {
    puVar6 = (uint *)__errno_location();
    printf("Read failed, errno %d\n",(ulong)*puVar6);
    return (FFSIndexItem)0x0;
  }
  *(undefined4 *)(in_RDI + 0x48) = 0;
  p_Var7 = parse_index_block(in_stack_00000030);
  *(FFSIndexItem *)(in_RDI + 0x90) = p_Var7;
  if (p_Var7->next_index_offset == (long)iVar3) {
    pvVar8 = ffs_malloc(s);
    *(void **)(in_RDI + 0x88) = pvVar8;
    plVar1 = *(long **)(in_RDI + 0x88);
    *plVar1 = p_Var7->next_index_offset;
    plVar1[1] = p_Var7->this_index_fpos;
    plVar1[2] = *(long *)&p_Var7->start_data_count;
    plVar1[3] = *(long *)&p_Var7->end_item_offset;
    **(long **)(in_RDI + 0x88) = lVar5;
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 8) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 0x10) = 0x100;
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 0xc) = 0;
    *(int *)(*(long *)(in_RDI + 0x88) + 0x14) = p_Var7->end_item_offset;
    pvVar8 = ffs_malloc(s);
    *(void **)(*(long *)(in_RDI + 0x88) + 0x18) = pvVar8;
    memset(*(void **)(*(long *)(in_RDI + 0x88) + 0x18),0,0x100);
    memcpy(*(void **)(*(long *)(in_RDI + 0x88) + 0x18),__src,s);
    *(int *)(in_RDI + 0x80) = p_Var7->last_data_count + 1;
  }
  free(__src);
  p_Var7->this_index_fpos = lVar5;
  if (*(long *)(in_RDI + 0xa0) == 0) {
    *(FFSIndexItem *)(in_RDI + 0xa0) = p_Var7;
    *(FFSIndexItem *)(in_RDI + 0xa8) = p_Var7;
    p_Var7->prev = (_FFSIndexItem *)0x0;
    p_Var7->next = (_FFSIndexItem *)0x0;
    return p_Var7;
  }
  *(FFSIndexItem *)(*(long *)(in_RDI + 0xa8) + 0x28) = p_Var7;
  p_Var7->prev = *(_FFSIndexItem **)(in_RDI + 0xa8);
  p_Var7->next = (_FFSIndexItem *)0x0;
  *(FFSIndexItem *)(in_RDI + 0xa8) = p_Var7;
  return p_Var7;
}

Assistant:

extern FFSIndexItem
FFSread_index(FFSFile ffsfile)
{
    char *index_data;
    FFSIndexItem index_item;
    off_t index_fpos;
    size_t index_size;
    int currentPos = ffs_file_lseek_func(ffsfile->file_id, (size_t)0, SEEK_CUR);
    int end = ffs_file_lseek_func(ffsfile->file_id, (size_t)0, SEEK_END);
    ffs_file_lseek_func(ffsfile->file_id, currentPos, SEEK_SET);   // seek back to original spot

    if (ffsfile->read_ahead == FALSE) {
	(void) next_record_type(ffsfile);
    }
    while (ffsfile->next_record_type != FFSindex) {
	if (!FFSconsume_next_item(ffsfile)) return NULL;
    }
    index_data = malloc(ffsfile->next_data_len);
    index_size = ffsfile->next_data_len;
    update_fpos(ffsfile);
    index_fpos = ffsfile->fpos - 4;
    if (ffsfile->read_func(ffsfile->file_id, index_data+4, 
			   ffsfile->next_data_len-4, NULL, NULL)
	!= ffsfile->next_data_len-4) {
	printf("Read failed, errno %d\n", errno);
	return NULL;
    }
    ffsfile->read_ahead = FALSE;
    index_item = parse_index_block(index_data);
    ffsfile->read_index = index_item;
    if (index_item->next_index_offset == end) {
	ffsfile->cur_index = malloc(sizeof(*(ffsfile->cur_index)));
	memcpy(ffsfile->cur_index, index_item, sizeof(*(ffsfile->cur_index)));
	ffsfile->cur_index->write_info.base_file_pos = index_fpos;
	ffsfile->cur_index->write_info.data_index_start = 0;
	ffsfile->cur_index->write_info.index_block_size = INDEX_BLOCK_SIZE;
	ffsfile->cur_index->write_info.data_index_end = 0;
	ffsfile->cur_index->write_info.next_item_offset = index_item->end_item_offset;
	ffsfile->cur_index->write_info.index_block = malloc(INDEX_BLOCK_SIZE);
	memset(	ffsfile->cur_index->write_info.index_block, 0, INDEX_BLOCK_SIZE);
	memcpy(ffsfile->cur_index->write_info.index_block, index_data, index_size);
	ffsfile->data_count = index_item->last_data_count+1;
    }
    free(index_data);
    index_item->this_index_fpos = index_fpos;
    if (ffsfile->index_head == NULL) {
	ffsfile->index_head = index_item;
	ffsfile->index_tail = index_item;
	index_item->prev = NULL;
	index_item->next = NULL;
    } else {
	ffsfile->index_tail->next = index_item;
	index_item->prev = ffsfile->index_tail;
	index_item->next = NULL;
	ffsfile->index_tail = index_item;
    }
    return index_item;
}